

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,SpeakerPosition *position)

{
  uint uVar1;
  CartesianSpeakerPosition local_d8;
  
  uVar1 = position->which_ >> 0x1f ^ position->which_;
  if (uVar1 < 0x14) {
    switch(uVar1) {
    case 0:
      PolarSpeakerPosition::PolarSpeakerPosition
                ((PolarSpeakerPosition *)&local_d8,(PolarSpeakerPosition *)&position->storage_);
      toCartesianVector3d(__return_storage_ptr__,(PolarSpeakerPosition *)&local_d8);
      break;
    case 1:
      CartesianSpeakerPosition::CartesianSpeakerPosition
                (&local_d8,(CartesianSpeakerPosition *)&position->storage_);
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] = local_d8.X;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] = local_d8.Y;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] = local_d8.Z;
      break;
    default:
      goto switchD_00146a2a_caseD_2;
    }
    ScreenEdgeLock::~ScreenEdgeLock(&local_d8.screenEdgeLock);
    return __return_storage_ptr__;
  }
switchD_00146a2a_caseD_2:
  boost::detail::variant::forced_return<Eigen::Matrix<double,3,1,0,3,1>>();
}

Assistant:

Eigen::Vector3d toCartesianVector3d(SpeakerPosition position) {
    return boost::apply_visitor(
        [](const auto& p) { return toCartesianVector3d(p); }, position);
  }